

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,REF_BOOL *improved)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS RVar4;
  undefined8 uVar5;
  REF_GEOM ref_geom;
  long lVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  REF_DBL uv_area;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  REF_GRID local_100;
  REF_GEOM local_f8;
  REF_DBL sign_uv_area;
  REF_DBL normdev;
  uint *local_e0;
  double local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  REF_NODE local_b0;
  REF_INT nodes [27];
  
  local_100 = ref_cavity->ref_grid;
  iVar8 = ref_cavity->surf_node;
  if (iVar8 == -1) {
    iVar8 = ref_cavity->node;
  }
  local_b0 = local_100->node;
  ref_cell = local_100->cell[3];
  local_f8 = local_100->geom;
  *improved = 1;
  local_c8 = 0;
  uStack_c4 = 0x40000000;
  uStack_c0 = 0;
  uStack_bc = 0;
  local_118 = 0xd7d7625a;
  uStack_114 = 0x6974e718;
  local_e0 = (uint *)improved;
  for (lVar9 = 0; ref_geom = local_f8, lVar9 < ref_cavity->tri_list->n; lVar9 = lVar9 + 1) {
    uVar3 = ref_cell_nodes(ref_cell,ref_cavity->tri_list->value[lVar9],nodes);
    if (uVar3 != 0) {
      pcVar7 = "cell";
      uVar5 = 0x995;
      goto LAB_0013291d;
    }
    uVar3 = ref_geom_tri_norm_deviation(local_100,nodes,&normdev);
    if (uVar3 != 0) {
      pcVar7 = "old tri normdev";
      uVar5 = 0x997;
      goto LAB_0013291d;
    }
    if (normdev <= (double)CONCAT44(uStack_c4,local_c8)) {
      local_c8 = SUB84(normdev,0);
      uStack_c4 = (undefined4)((ulong)normdev >> 0x20);
    }
    if (local_f8->meshlink == (void *)0x0) {
      uVar3 = ref_geom_uv_area(local_f8,nodes,&uv_area);
      if (uVar3 != 0) {
        pcVar7 = "uv area";
        uVar5 = 0x99a;
        goto LAB_0013291d;
      }
      uVar3 = ref_geom_uv_area_sign(local_100,nodes[3],&sign_uv_area);
      if (uVar3 != 0) {
        pcVar7 = "sign";
        uVar5 = 0x99b;
        goto LAB_0013291d;
      }
      uv_area = sign_uv_area * uv_area;
      dVar11 = (double)CONCAT44(uStack_114,local_118);
      if (uv_area <= (double)CONCAT44(uStack_114,local_118)) {
        dVar11 = uv_area;
      }
      local_118 = SUB84(dVar11,0);
      uStack_114 = (undefined4)((ulong)dVar11 >> 0x20);
    }
  }
  if (ref_cavity->debug != 0) {
    printf("- min %12.8f %12.8f\n",local_c8,CONCAT44(uStack_114,local_118));
  }
  local_118 = 0;
  uStack_114 = 0x40000000;
  uStack_110 = 0;
  uStack_10c = 0;
  local_d8 = 1e+200;
  uStack_d0 = 0;
  lVar9 = 0;
  lVar10 = 0;
  do {
    if (ref_cavity->maxseg <= lVar10) {
      if (ref_cavity->debug != 0) {
        printf("+ min %12.8f %12.8f\n",local_118);
      }
      *local_e0 = -(uint)((double)CONCAT44(uStack_c4,local_c8) <
                          (double)CONCAT44(uStack_114,local_118) && local_b0->min_uv_area < local_d8
                         ) & 1;
      return 0;
    }
    pRVar1 = ref_cavity->s2n;
    if (pRVar1[lVar10 * 3] != -1) {
      bVar2 = false;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        if (iVar8 == *(int *)((long)pRVar1 + lVar6 * 4 + lVar9)) {
          bVar2 = true;
        }
      }
      if (!bVar2) {
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          nodes[lVar6] = *(REF_INT *)((long)pRVar1 + lVar6 * 4 + lVar9);
        }
        nodes[3] = pRVar1[lVar10 * 3 + 2];
        nodes[2] = iVar8;
        RVar4 = ref_geom_tri_norm_deviation(local_100,nodes,&normdev);
        if (RVar4 != 0) {
          *local_e0 = 0;
          return 0;
        }
        if (normdev <= (double)CONCAT44(uStack_114,local_118)) {
          local_118 = SUB84(normdev,0);
          uStack_114 = (undefined4)((ulong)normdev >> 0x20);
        }
        if (ref_geom->meshlink == (void *)0x0) {
          uVar3 = ref_geom_uv_area(ref_geom,nodes,&uv_area);
          if (uVar3 != 0) {
            pcVar7 = "uv area";
            uVar5 = 0x9bb;
LAB_0013291d:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar5,"ref_cavity_normdev",(ulong)uVar3,pcVar7);
            return uVar3;
          }
          uVar3 = ref_geom_uv_area_sign(local_100,nodes[3],&sign_uv_area);
          if (uVar3 != 0) {
            pcVar7 = "sign";
            uVar5 = 0x9bc;
            goto LAB_0013291d;
          }
          uv_area = sign_uv_area * uv_area;
          ref_geom = local_f8;
          if (uv_area <= local_d8) {
            local_d8 = uv_area;
          }
        }
      }
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_normdev(REF_CAVITY ref_cavity,
                                      REF_BOOL *improved) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node;
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev, min_normdev, old_normdev;
  REF_DBL sign_uv_area, uv_area, min_uv_area;
  REF_INT seg, seg_node;
  REF_BOOL skip;

  node = ref_cavity_seg_node(ref_cavity);

  *improved = REF_TRUE;

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev),
        "old tri normdev");
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  old_normdev = min_normdev;

  if (ref_cavity_debug(ref_cavity))
    printf("- min %12.8f %12.8f\n", min_normdev, min_uv_area);

  min_normdev = 2.0;
  min_uv_area = REF_DBL_MAX;
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      if (node == ref_cavity_s2n(ref_cavity, seg_node, seg)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      nodes[seg_node] = ref_cavity_s2n(ref_cavity, seg_node, seg);
    }
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
      *improved = REF_FALSE;
      return REF_SUCCESS;
    }
    min_normdev = MIN(min_normdev, normdev);
    if (!ref_geom_meshlinked(ref_geom)) {
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
      uv_area *= sign_uv_area;
      min_uv_area = MIN(min_uv_area, uv_area);
    }
  }
  if (ref_cavity_debug(ref_cavity))
    printf("+ min %12.8f %12.8f\n", min_normdev, min_uv_area);

  *improved = (min_uv_area > ref_node_min_uv_area(ref_node) &&
               min_normdev > old_normdev);

  return REF_SUCCESS;
}